

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::setEqual
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *to,Bucket *from)

{
  bool bVar1;
  size_t sVar2;
  Bucket *rt;
  Bucket *in_RDX;
  Bucket *in_RSI;
  long in_RDI;
  pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *pair;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
  *__range4;
  Bucket *in_stack_ffffffffffffffa8;
  Bucket *in_stack_ffffffffffffffb0;
  Bucket *in_stack_ffffffffffffffc0;
  Bucket *in_stack_ffffffffffffffc8;
  iterator in_stack_ffffffffffffffd0;
  __normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>_>
  local_28;
  long local_20;
  
  sVar2 = getBorderId((RelationsGraph<dg::vr::ValueRelations> *)in_stack_ffffffffffffffc8,
                      in_stack_ffffffffffffffc0);
  if (sVar2 != 0xffffffffffffffff) {
    local_20 = in_RDI + 0x40;
    local_28._M_current =
         (pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *)
         std::
         vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
         ::begin((vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                  *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffd0 =
         std::
         vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
         ::end((vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                *)in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      in_stack_ffffffffffffffb0 = in_RDX;
      in_stack_ffffffffffffffc8 =
           (Bucket *)
           __gnu_cxx::
           __normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>_>
           ::operator*(&local_28);
      in_RDX = in_stack_ffffffffffffffb0;
      rt = std::reference_wrapper::operator_cast_to_Bucket_
                     ((reference_wrapper<const_dg::vr::Bucket> *)0x1e5ed9);
      bVar1 = vr::operator==(in_stack_ffffffffffffffb0,rt);
      if (bVar1) {
        std::reference_wrapper<dg::vr::Bucket_const>::
        reference_wrapper<dg::vr::Bucket&,void,dg::vr::Bucket_const*>
                  ((reference_wrapper<const_dg::vr::Bucket> *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
        *(Bucket **)&((_Rep_type *)(in_stack_ffffffffffffffc8->relatedBuckets)._M_elems)->_M_impl =
             in_stack_ffffffffffffffc0;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_*,_std::vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>_>
      ::operator++(&local_28);
    }
  }
  ValueRelations::areMerged((ValueRelations *)from,(Handle)__range4,(Handle)__begin4._M_current);
  Bucket::merge(in_RSI,in_RDX);
  erase((RelationsGraph<dg::vr::ValueRelations> *)in_stack_ffffffffffffffd0._M_current,
        in_stack_ffffffffffffffc8);
  return true;
}

Assistant:

bool setEqual(Bucket &to, Bucket &from) {
        assert(to != from);
        if (getBorderId(from) != std::string::npos) {
            assert(getBorderId(to) ==
                   std::string::npos); // cannot merge two border buckets
            for (auto &pair : borderBuckets) {
                if (from == pair.second)
                    pair.second = to;
            }
        }
        reported.areMerged(to, from);
        to.merge(from);
        erase(from);
        return true;
    }